

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265d_vdpu383.c
# Opt level: O0

MPP_RET hal_h265d_vdpu383_deinit(void *hal)

{
  uint uVar1;
  uint local_20;
  RK_U32 i;
  RK_U32 loop;
  HalH265dCtx *reg_ctx;
  void *hal_local;
  
  if (*(long *)((long)hal + 0x1c8) != 0) {
    mpp_buffer_put_with_caller(*(MppBuffer *)((long)hal + 0x1c8),"hal_h265d_vdpu383_deinit");
    *(undefined8 *)((long)hal + 0x1c8) = 0;
  }
  uVar1 = 1;
  if (*(int *)((long)hal + 0x180) != 0) {
    uVar1 = 3;
  }
  for (local_20 = 0; local_20 < uVar1; local_20 = local_20 + 1) {
    if (*(long *)((long)hal + (ulong)local_20 * 8 + 0xe8) != 0) {
      mpp_buffer_put_with_caller
                (*(MppBuffer *)((long)hal + (ulong)local_20 * 8 + 0xe8),"hal_h265d_vdpu383_deinit");
      *(undefined8 *)((long)hal + (ulong)local_20 * 8 + 0xe8) = 0;
    }
  }
  if (*(long *)((long)hal + 0x30) != 0) {
    mpp_buffer_group_put(*(MppBufferGroup *)((long)hal + 0x30));
    *(undefined8 *)((long)hal + 0x30) = 0;
  }
  for (local_20 = 0; local_20 < uVar1; local_20 = local_20 + 1) {
    if (*(long *)((long)hal + (ulong)local_20 * 0x28 + 0x128) != 0) {
      mpp_osal_free("hal_h265d_vdpu383_deinit",
                    *(void **)((long)hal + (ulong)local_20 * 0x28 + 0x128));
    }
    *(undefined8 *)((long)hal + (ulong)local_20 * 0x28 + 0x128) = 0;
  }
  if (*(long *)((long)hal + 0x1a0) != 0) {
    mpp_osal_free("hal_h265d_vdpu383_deinit",*(void **)((long)hal + 0x1a0));
  }
  *(undefined8 *)((long)hal + 0x1a0) = 0;
  if (*(long *)((long)hal + 0x198) != 0) {
    mpp_osal_free("hal_h265d_vdpu383_deinit",*(void **)((long)hal + 0x198));
  }
  *(undefined8 *)((long)hal + 0x198) = 0;
  if (*(long *)((long)hal + 0x208) != 0) {
    mpp_osal_free("hal_h265d_vdpu383_deinit",*(void **)((long)hal + 0x208));
  }
  *(undefined8 *)((long)hal + 0x208) = 0;
  if (*(long *)((long)hal + 0x210) != 0) {
    mpp_osal_free("hal_h265d_vdpu383_deinit",*(void **)((long)hal + 0x210));
  }
  *(undefined8 *)((long)hal + 0x210) = 0;
  if (*(long *)((long)hal + 0x1a8) != 0) {
    hal_bufs_deinit(*(HalBufs *)((long)hal + 0x1a8));
    *(undefined8 *)((long)hal + 0x1a8) = 0;
  }
  if (*(long *)((long)hal + 0x218) != 0) {
    hal_bufs_deinit(*(HalBufs *)((long)hal + 0x218));
    *(undefined8 *)((long)hal + 0x218) = 0;
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h265d_vdpu383_deinit(void *hal)
{
    HalH265dCtx *reg_ctx = (HalH265dCtx *)hal;
    RK_U32 loop = reg_ctx->fast_mode ? MPP_ARRAY_ELEMS(reg_ctx->g_buf) : 1;
    RK_U32 i;

    if (reg_ctx->bufs) {
        mpp_buffer_put(reg_ctx->bufs);
        reg_ctx->bufs = NULL;
    }

    loop = reg_ctx->fast_mode ? MPP_ARRAY_ELEMS(reg_ctx->rcb_buf) : 1;
    for (i = 0; i < loop; i++) {
        if (reg_ctx->rcb_buf[i]) {
            mpp_buffer_put(reg_ctx->rcb_buf[i]);
            reg_ctx->rcb_buf[i] = NULL;
        }
    }

    if (reg_ctx->group) {
        mpp_buffer_group_put(reg_ctx->group);
        reg_ctx->group = NULL;
    }

    for (i = 0; i < loop; i++)
        MPP_FREE(reg_ctx->g_buf[i].hw_regs);

    MPP_FREE(reg_ctx->scaling_qm);
    MPP_FREE(reg_ctx->scaling_rk);
    MPP_FREE(reg_ctx->pps_buf);
    MPP_FREE(reg_ctx->sw_rps_buf);

    if (reg_ctx->cmv_bufs) {
        hal_bufs_deinit(reg_ctx->cmv_bufs);
        reg_ctx->cmv_bufs = NULL;
    }

    if (reg_ctx->origin_bufs) {
        hal_bufs_deinit(reg_ctx->origin_bufs);
        reg_ctx->origin_bufs = NULL;
    }

    return MPP_OK;
}